

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

void ox_buffer_adjustto_head(buffer_s *self)

{
  size_t sVar1;
  size_t __n;
  
  sVar1 = self->read_pos;
  if (sVar1 != 0) {
    __n = self->write_pos - sVar1;
    if (__n != 0) {
      memmove(self->data,self->data + sVar1,__n);
    }
    self->read_pos = 0;
    self->write_pos = __n;
  }
  return;
}

Assistant:

void 
ox_buffer_adjustto_head(struct buffer_s* self)
{
    size_t len = 0;

    if(self->read_pos <= 0)
    {
        return;
    }

    len = ox_buffer_getreadvalidcount(self);
    if (len > 0)
    {
        memmove(self->data, self->data + self->read_pos, len);
    }

    self->read_pos = 0;
    self->write_pos = len;
}